

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::subspan
          (span<int,_18446744073709551615UL> *this,size_type offset,size_type count)

{
  pointer piVar1;
  ulong uVar2;
  span<int,_18446744073709551615UL> local_28;
  
  uVar2 = this->size_;
  if (uVar2 < offset) {
LAB_00190720:
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1209: Precondition violation."
              );
    piVar1 = this->data_;
    if (count != 0xffffffffffffffff) goto LAB_00190749;
    uVar2 = this->size_;
  }
  else {
    if (count != 0xffffffffffffffff) {
      if (count + offset <= uVar2) {
        piVar1 = this->data_;
        goto LAB_00190749;
      }
      goto LAB_00190720;
    }
    piVar1 = this->data_;
  }
  count = uVar2 - offset;
LAB_00190749:
  span<int_*,_0>(&local_28,piVar1 + offset,count);
  return local_28;
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    subspan( size_type offset, size_type count = static_cast<size_type>(dynamic_extent) ) const
    {
        span_EXPECTS(
            ( ( detail::is_positive( offset ) && offset <= size() ) ) &&
            ( count == static_cast<size_type>(dynamic_extent) || ( detail::is_positive( count ) && offset + count <= size() ) )
        );

        return span< element_type, dynamic_extent >(
            data() + offset, count == static_cast<size_type>(dynamic_extent) ? size() - offset : count );
    }